

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O2

void __thiscall duckdb::DeleteLocalState::~DeleteLocalState(DeleteLocalState *this)

{
  (this->super_LocalSinkState)._vptr_LocalSinkState = (_func_int **)&PTR__DeleteLocalState_027bda20;
  ::std::unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>::
  ~unique_ptr(&(this->delete_state).
               super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
             );
  DataChunk::~DataChunk(&this->delete_chunk);
  LocalSinkState::~LocalSinkState(&this->super_LocalSinkState);
  return;
}

Assistant:

DeleteLocalState(ClientContext &context, TableCatalogEntry &table,
	                 const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
		const auto &types = table.GetTypes();
		auto initialize = vector<bool>(types.size(), false);
		delete_chunk.Initialize(Allocator::Get(context), types, initialize);

		auto &storage = table.GetStorage();
		delete_state = storage.InitializeDelete(table, context, bound_constraints);
	}